

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O0

int SmoothenBlock(uint8_t *a_ptr,int a_stride,uint8_t *y_ptr,int y_stride,int width,int height)

{
  uint8_t avg_u8;
  uint8_t *luma_ptr;
  uint8_t *alpha_ptr;
  int y;
  int x;
  int count;
  int sum;
  int height_local;
  int width_local;
  int y_stride_local;
  uint8_t *y_ptr_local;
  int a_stride_local;
  uint8_t *a_ptr_local;
  
  sum = 0;
  count = 0;
  luma_ptr = y_ptr;
  alpha_ptr = a_ptr;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      if (alpha_ptr[x] != '\0') {
        count = count + 1;
        sum = (uint)luma_ptr[x] + sum;
      }
    }
    alpha_ptr = alpha_ptr + a_stride;
    luma_ptr = luma_ptr + y_stride;
  }
  if ((0 < count) && (count < width * height)) {
    luma_ptr = y_ptr;
    alpha_ptr = a_ptr;
    for (y = 0; y < height; y = y + 1) {
      for (x = 0; x < width; x = x + 1) {
        if (alpha_ptr[x] == '\0') {
          luma_ptr[x] = (uint8_t)(sum / count);
        }
      }
      alpha_ptr = alpha_ptr + a_stride;
      luma_ptr = luma_ptr + y_stride;
    }
  }
  return (int)(count == 0);
}

Assistant:

static int SmoothenBlock(const uint8_t* a_ptr, int a_stride, uint8_t* y_ptr,
                         int y_stride, int width, int height) {
  int sum = 0, count = 0;
  int x, y;
  const uint8_t* alpha_ptr = a_ptr;
  uint8_t* luma_ptr = y_ptr;
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      if (alpha_ptr[x] != 0) {
        ++count;
        sum += luma_ptr[x];
      }
    }
    alpha_ptr += a_stride;
    luma_ptr += y_stride;
  }
  if (count > 0 && count < width * height) {
    const uint8_t avg_u8 = (uint8_t)(sum / count);
    alpha_ptr = a_ptr;
    luma_ptr = y_ptr;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        if (alpha_ptr[x] == 0) luma_ptr[x] = avg_u8;
      }
      alpha_ptr += a_stride;
      luma_ptr += y_stride;
    }
  }
  return (count == 0);
}